

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_poll(pollfd *pfd,uint n,int milliseconds,stop_flag_t *stop_flag)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int __timeout;
  
  bVar2 = true;
  if ((n == 1) && ((pfd->events & 8U) == 0)) {
    pfd->events = pfd->events | 8;
    bVar2 = false;
  }
  __timeout = 200;
  do {
    if (*stop_flag != 0) {
      return -2;
    }
    iVar5 = __timeout;
    if (milliseconds < __timeout) {
      iVar5 = milliseconds;
    }
    if (-1 < milliseconds) {
      __timeout = iVar5;
    }
    iVar3 = poll((pollfd *)pfd,(ulong)n,__timeout);
    if (iVar3 != 0) {
      if (iVar3 == 1) {
LAB_00123dbf:
        if (bVar2) {
          return iVar3;
        }
        if ((pfd->revents & 0xdU) != 8) {
          return iVar3;
        }
        return -1;
      }
      piVar4 = __errno_location();
      if ((*piVar4 != 4) && (*piVar4 != 0xb)) goto LAB_00123dbf;
    }
    if (milliseconds < 1) {
      iVar5 = 0;
    }
    iVar3 = milliseconds - iVar5;
    bVar1 = milliseconds < iVar5;
    milliseconds = iVar3;
    if (iVar3 == 0 || bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
mg_poll(struct mg_pollfd *pfd,
        unsigned int n,
        int milliseconds,
        const stop_flag_t *stop_flag)
{
	/* Call poll, but only for a maximum time of a few seconds.
	 * This will allow to stop the server after some seconds, instead
	 * of having to wait for a long socket timeout. */
	int ms_now = SOCKET_TIMEOUT_QUANTUM; /* Sleep quantum in ms */

	int check_pollerr = 0;
	if ((n == 1) && ((pfd[0].events & POLLERR) == 0)) {
		/* If we wait for only one file descriptor, wait on error as well */
		pfd[0].events |= POLLERR;
		check_pollerr = 1;
	}

	do {
		int result;

		if (!STOP_FLAG_IS_ZERO(&*stop_flag)) {
			/* Shut down signal */
			return -2;
		}

		if ((milliseconds >= 0) && (milliseconds < ms_now)) {
			ms_now = milliseconds;
		}

		result = poll(pfd, n, ms_now);
		if (result != 0) {
			int err = ERRNO;
			if ((result == 1) || (!ERROR_TRY_AGAIN(err))) {
				/* Poll returned either success (1) or error (-1).
				 * Forward both to the caller. */
				if ((check_pollerr)
				    && ((pfd[0].revents & (POLLIN | POLLOUT | POLLERR))
				        == POLLERR)) {
					/* One and only file descriptor returned error */
					return -1;
				}
				return result;
			}
		}

		/* Poll returned timeout (0). */
		if (milliseconds > 0) {
			milliseconds -= ms_now;
		}

	} while (milliseconds > 0);

	/* timeout: return 0 */
	return 0;
}